

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int http_RequestAndResponse
              (uri_type *destination,char *request,size_t request_length,http_method_t req_method,
              int timeout_secs,http_parser_t *response)

{
  int iVar1;
  socklen_t addrlen;
  undefined1 local_d8 [8];
  SOCKINFO info;
  int http_error_code;
  size_t sockaddr_len;
  int ret_code;
  SOCKET tcp_connection;
  http_parser_t *response_local;
  int timeout_secs_local;
  http_method_t req_method_local;
  size_t request_length_local;
  char *request_local;
  uri_type *destination_local;
  
  response_local._0_4_ = timeout_secs;
  response_local._4_4_ = req_method;
  _timeout_secs_local = request_length;
  request_length_local = (size_t)request;
  request_local = (char *)destination;
  iVar1 = socket((uint)(destination->hostport).IPaddress.ss_family,1,0);
  if (iVar1 == -1) {
    parser_response_init(response,response_local._4_4_);
    destination_local._4_4_ = -0xd0;
  }
  else {
    iVar1 = sock_init((SOCKINFO *)local_d8,iVar1);
    if (iVar1 == 0) {
      addrlen = 0x10;
      if (*(short *)(request_local + 0x50) == 10) {
        addrlen = 0x1c;
      }
      iVar1 = private_connect(local_d8._0_4_,(sockaddr *)(request_local + 0x50),addrlen);
      if (iVar1 == -1) {
        parser_response_init(response,response_local._4_4_);
        sockaddr_len._0_4_ = -0xcc;
      }
      else {
        sockaddr_len._0_4_ =
             http_SendMessage((SOCKINFO *)local_d8,(int *)&response_local,"b",request_length_local,
                              _timeout_secs_local);
        if ((int)sockaddr_len == 0) {
          sockaddr_len._0_4_ =
               http_RecvMessage((SOCKINFO *)local_d8,response,response_local._4_4_,
                                (int *)&response_local,
                                (int *)((long)&info.foreign_sockaddr.__ss_align + 4));
        }
        else {
          parser_response_init(response,response_local._4_4_);
        }
      }
    }
    else {
      parser_response_init(response,response_local._4_4_);
      sockaddr_len._0_4_ = -0xd0;
    }
    sock_destroy((SOCKINFO *)local_d8,2);
    destination_local._4_4_ = (int)sockaddr_len;
  }
  return destination_local._4_4_;
}

Assistant:

int http_RequestAndResponse(uri_type *destination,
	const char *request,
	size_t request_length,
	http_method_t req_method,
	int timeout_secs,
	http_parser_t *response)
{
	SOCKET tcp_connection;
	int ret_code;
	size_t sockaddr_len;
	int http_error_code;
	SOCKINFO info;

	tcp_connection = socket(
		(int)destination->hostport.IPaddress.ss_family, SOCK_STREAM, 0);
	if (tcp_connection == INVALID_SOCKET) {
		parser_response_init(response, req_method);
		return UPNP_E_SOCKET_ERROR;
	}
	if (sock_init(&info, tcp_connection) != UPNP_E_SUCCESS) {
		parser_response_init(response, req_method);
		ret_code = UPNP_E_SOCKET_ERROR;
		goto end_function;
	}
	/* connect */
	sockaddr_len = destination->hostport.IPaddress.ss_family == AF_INET6
			       ? sizeof(struct sockaddr_in6)
			       : sizeof(struct sockaddr_in);
	ret_code = private_connect(info.socket,
		(struct sockaddr *)&(destination->hostport.IPaddress),
		(socklen_t)sockaddr_len);
	if (ret_code == -1) {
		parser_response_init(response, req_method);
		ret_code = UPNP_E_SOCKET_CONNECT;
		goto end_function;
	}
	/* send request */
	ret_code = http_SendMessage(
		&info, &timeout_secs, "b", request, request_length);
	if (ret_code != 0) {
		parser_response_init(response, req_method);
		goto end_function;
	}
	/* recv response */
	ret_code = http_RecvMessage(
		&info, response, req_method, &timeout_secs, &http_error_code);

end_function:
	/* should shutdown completely */
	sock_destroy(&info, SD_BOTH);

	return ret_code;
}